

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O0

void soplex::
     SPxQuicksort<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
               (Breakpoint *keys,int end,BreakpointCompare *compare,int start,bool type)

{
  bool bVar1;
  int in_ECX;
  Breakpoint *in_RDX;
  int in_ESI;
  undefined1 in_R8B;
  int mid;
  int hi;
  int lo;
  Breakpoint tmp;
  Breakpoint pivotkey;
  Breakpoint *in_stack_fffffffffffff4e8;
  Breakpoint *a;
  uint7 in_stack_fffffffffffff4f0;
  undefined1 in_stack_fffffffffffff4f7;
  Breakpoint *in_stack_fffffffffffff4f8;
  undefined1 local_af9;
  Breakpoint *in_stack_fffffffffffff508;
  Breakpoint *j;
  undefined7 in_stack_fffffffffffff510;
  undefined1 in_stack_fffffffffffff517;
  undefined1 uVar2;
  Breakpoint *in_stack_fffffffffffff518;
  undefined1 local_ad9;
  undefined1 local_ac9;
  undefined1 local_ab9;
  int in_stack_fffffffffffff71c;
  BreakpointCompare *in_stack_fffffffffffff720;
  int in_stack_fffffffffffff72c;
  Breakpoint *in_stack_fffffffffffff730;
  undefined4 local_138;
  undefined4 local_134;
  undefined1 in_stack_ffffffffffffffdb;
  int in_stack_ffffffffffffffdc;
  undefined3 in_stack_ffffffffffffffe0;
  uint uVar3;
  int iVar4;
  int end_00;
  undefined4 in_stack_fffffffffffffff0;
  int iVar5;
  
  uVar3 = CONCAT13(in_R8B,in_stack_ffffffffffffffe0);
  if (in_ECX + 1 < in_ESI) {
    local_138 = in_ESI + -1;
    local_134 = in_ECX;
    while (uVar3 = uVar3 & 0x1ffffff, 0x18 < local_138 - local_134) {
      SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Breakpoint::Breakpoint(in_stack_fffffffffffff4e8);
      SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Breakpoint::Breakpoint(in_stack_fffffffffffff4e8);
      SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Breakpoint::operator=
                ((Breakpoint *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0),
                 in_stack_fffffffffffff4e8);
      iVar4 = local_134;
      a = in_RDX;
      iVar5 = local_138;
      while( true ) {
        if ((uVar3 & 0x1000000) == 0) {
          while( true ) {
            local_ad9 = false;
            j = a;
            if (local_134 < iVar5) {
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::Breakpoint::Breakpoint
                        ((Breakpoint *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0)
                         ,in_stack_fffffffffffff4e8);
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::Breakpoint::Breakpoint
                        ((Breakpoint *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0)
                         ,in_stack_fffffffffffff4e8);
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::BreakpointCompare::operator()
                        ((BreakpointCompare *)a,
                         (Breakpoint *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510)
                         ,in_stack_fffffffffffff508);
              local_ad9 = boost::multiprecision::operator<=
                                    (&in_stack_fffffffffffff4f8->val,
                                     (int *)CONCAT17(in_stack_fffffffffffff4f7,
                                                     in_stack_fffffffffffff4f0));
              in_stack_fffffffffffff518 = a;
            }
            if (local_ad9 == false) break;
            local_134 = local_134 + 1;
            a = j;
          }
          while( true ) {
            uVar2 = false;
            a = j;
            if (iVar4 < local_138) {
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::Breakpoint::Breakpoint
                        ((Breakpoint *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0)
                         ,in_stack_fffffffffffff4e8);
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::Breakpoint::Breakpoint
                        ((Breakpoint *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0)
                         ,in_stack_fffffffffffff4e8);
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::BreakpointCompare::operator()
                        ((BreakpointCompare *)in_stack_fffffffffffff518,
                         (Breakpoint *)CONCAT17(uVar2,in_stack_fffffffffffff510),j);
              uVar2 = boost::multiprecision::operator>
                                (&in_stack_fffffffffffff4f8->val,
                                 (int *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0
                                                ));
              in_stack_fffffffffffff508 = j;
            }
            if ((type_conflict5)uVar2 == false) break;
            local_138 = local_138 + -1;
            j = a;
          }
          in_stack_fffffffffffff517 = 0;
        }
        else {
          while( true ) {
            local_ab9 = false;
            if (local_134 < iVar5) {
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::Breakpoint::Breakpoint
                        ((Breakpoint *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0)
                         ,in_stack_fffffffffffff4e8);
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::Breakpoint::Breakpoint
                        ((Breakpoint *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0)
                         ,in_stack_fffffffffffff4e8);
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::BreakpointCompare::operator()
                        ((BreakpointCompare *)in_stack_fffffffffffff518,
                         (Breakpoint *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510)
                         ,in_stack_fffffffffffff508);
              local_ab9 = boost::multiprecision::operator<
                                    (&in_stack_fffffffffffff4f8->val,
                                     (int *)CONCAT17(in_stack_fffffffffffff4f7,
                                                     in_stack_fffffffffffff4f0));
            }
            if (local_ab9 == false) break;
            local_134 = local_134 + 1;
          }
          while( true ) {
            local_ac9 = false;
            if (iVar4 < local_138) {
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::Breakpoint::Breakpoint
                        ((Breakpoint *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0)
                         ,in_stack_fffffffffffff4e8);
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::Breakpoint::Breakpoint
                        ((Breakpoint *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0)
                         ,in_stack_fffffffffffff4e8);
              SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::BreakpointCompare::operator()
                        ((BreakpointCompare *)in_stack_fffffffffffff518,
                         (Breakpoint *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510)
                         ,in_stack_fffffffffffff508);
              local_ac9 = boost::multiprecision::operator>=
                                    (&in_stack_fffffffffffff4f8->val,
                                     (int *)CONCAT17(in_stack_fffffffffffff4f7,
                                                     in_stack_fffffffffffff4f0));
            }
            if (local_ac9 == false) break;
            local_138 = local_138 + -1;
          }
        }
        if (local_138 <= local_134) break;
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::Breakpoint::operator=
                  ((Breakpoint *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0),
                   in_stack_fffffffffffff4e8);
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::Breakpoint::operator=
                  ((Breakpoint *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0),
                   in_stack_fffffffffffff4e8);
        SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::Breakpoint::operator=
                  ((Breakpoint *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0),
                   in_stack_fffffffffffff4e8);
        local_134 = local_134 + 1;
        local_138 = local_138 + -1;
      }
      if ((uVar3 & 0x1000000) == 0) {
        while( true ) {
          in_stack_fffffffffffff4f7 = false;
          in_RDX = a;
          if (iVar4 < local_138) {
            SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::Breakpoint::Breakpoint((Breakpoint *)(ulong)in_stack_fffffffffffff4f0,a);
            SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::Breakpoint::Breakpoint
                      ((Breakpoint *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0),a
                      );
            SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::BreakpointCompare::operator()
                      ((BreakpointCompare *)in_stack_fffffffffffff518,
                       (Breakpoint *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),
                       in_stack_fffffffffffff508);
            in_stack_fffffffffffff4f7 =
                 boost::multiprecision::operator<=
                           (&in_stack_fffffffffffff4f8->val,
                            (int *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0));
            in_stack_fffffffffffff4e8 = a;
          }
          if ((type_conflict5)in_stack_fffffffffffff4f7 == false) break;
          local_138 = local_138 + -1;
          a = in_RDX;
        }
        if (local_138 == iVar5) {
          SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::Breakpoint::operator=
                    ((Breakpoint *)(ulong)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
          SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::Breakpoint::operator=
                    ((Breakpoint *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0),
                     in_stack_fffffffffffff4e8);
          SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::Breakpoint::operator=
                    ((Breakpoint *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0),
                     in_stack_fffffffffffff4e8);
          local_138 = local_138 + -1;
        }
      }
      else {
        while( true ) {
          local_af9 = false;
          in_RDX = a;
          if (local_134 < iVar5) {
            SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::Breakpoint::Breakpoint
                      ((Breakpoint *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0),
                       in_stack_fffffffffffff4e8);
            SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::Breakpoint::Breakpoint
                      ((Breakpoint *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0),
                       in_stack_fffffffffffff4e8);
            SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::BreakpointCompare::operator()
                      ((BreakpointCompare *)in_stack_fffffffffffff518,
                       (Breakpoint *)CONCAT17(in_stack_fffffffffffff517,in_stack_fffffffffffff510),
                       in_stack_fffffffffffff508);
            local_af9 = boost::multiprecision::operator>=
                                  (&a->val,(int *)CONCAT17(in_stack_fffffffffffff4f7,
                                                           in_stack_fffffffffffff4f0));
            in_stack_fffffffffffff4f8 = a;
          }
          if (local_af9 == false) break;
          local_134 = local_134 + 1;
          a = in_RDX;
        }
        if (local_134 == iVar4) {
          SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::Breakpoint::operator=
                    ((Breakpoint *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0),
                     in_stack_fffffffffffff4e8);
          SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::Breakpoint::operator=
                    ((Breakpoint *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0),
                     in_stack_fffffffffffff4e8);
          SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::Breakpoint::operator=
                    ((Breakpoint *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0),
                     in_stack_fffffffffffff4e8);
          local_134 = local_134 + 1;
        }
      }
      end_00 = (int)((ulong)in_RDX >> 0x20);
      if (iVar5 - local_134 < local_138 - iVar4) {
        bVar1 = local_134 < iVar5;
        local_134 = iVar4;
        if (bVar1) {
          SPxQuicksort<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
                    ((Breakpoint *)CONCAT44(iVar5,in_stack_fffffffffffffff0),end_00,
                     (BreakpointCompare *)CONCAT44(iVar4,uVar3),in_stack_ffffffffffffffdc,
                     (bool)in_stack_ffffffffffffffdb);
          local_134 = iVar4;
        }
      }
      else {
        bVar1 = iVar4 < local_138;
        local_138 = iVar5;
        if (bVar1) {
          SPxQuicksort<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
                    ((Breakpoint *)CONCAT44(iVar5,in_stack_fffffffffffffff0),end_00,
                     (BreakpointCompare *)CONCAT44(iVar4,uVar3),in_stack_ffffffffffffffdc,
                     (bool)in_stack_ffffffffffffffdb);
          local_138 = iVar5;
        }
      }
      uVar3 = uVar3 ^ 0xff000000;
    }
    if (0 < local_138 - local_134) {
      SPxShellsort<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
                (in_stack_fffffffffffff730,in_stack_fffffffffffff72c,in_stack_fffffffffffff720,
                 in_stack_fffffffffffff71c);
    }
  }
  return;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}